

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalNinjaGenerator.cxx
# Opt level: O2

void __thiscall
cmLocalNinjaGenerator::AppendCustomCommandDeps
          (cmLocalNinjaGenerator *this,cmCustomCommandGenerator *ccg,cmNinjaDeps *ninjaDeps)

{
  bool bVar1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar2;
  pointer inName;
  string dep;
  string local_70;
  string local_50;
  
  pvVar2 = cmCustomCommandGenerator::GetDepends_abi_cxx11_(ccg);
  for (inName = (pvVar2->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
      inName != (pvVar2->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish; inName = inName + 1) {
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    local_70._M_string_length = 0;
    local_70.field_2._M_local_buf[0] = '\0';
    bVar1 = cmLocalGenerator::GetRealDependency
                      ((cmLocalGenerator *)this,inName,
                       &(this->super_cmLocalCommonGenerator).ConfigName,&local_70);
    if (bVar1) {
      cmGlobalNinjaGenerator::ConvertToNinjaPath
                (&local_50,
                 (cmGlobalNinjaGenerator *)
                 (this->super_cmLocalCommonGenerator).super_cmLocalGenerator.GlobalGenerator,
                 &local_70);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)ninjaDeps,
                 &local_50);
      std::__cxx11::string::~string((string *)&local_50);
    }
    std::__cxx11::string::~string((string *)&local_70);
  }
  return;
}

Assistant:

void cmLocalNinjaGenerator::AppendCustomCommandDeps(
  cmCustomCommandGenerator const& ccg,
  cmNinjaDeps &ninjaDeps)
{
  const std::vector<std::string> &deps = ccg.GetDepends();
  for (std::vector<std::string>::const_iterator i = deps.begin();
       i != deps.end(); ++i) {
    std::string dep;
    if (this->GetRealDependency(*i, this->GetConfigName(), dep))
      ninjaDeps.push_back(
        this->GetGlobalNinjaGenerator()->ConvertToNinjaPath(dep));
  }
}